

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int parseHhMmSs(char *zDate,DateTime *p)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *zDate_00;
  long in_FS_OFFSET;
  bool bVar8;
  double dVar9;
  double dVar10;
  int s;
  int m;
  int h;
  int nMn;
  int nHr;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = -0x55555556;
  local_38 = -0x55555556;
  local_3c = -0x55555556;
  iVar3 = getDigits(zDate,"20c:20e");
  uVar6 = 1;
  if (iVar3 != 2) goto LAB_001b8243;
  if (zDate[5] == ':') {
    iVar3 = getDigits(zDate + 6,"20e",&local_3c);
    if (iVar3 != 1) goto LAB_001b8243;
    zDate_00 = (byte *)(zDate + 8);
    dVar10 = 0.0;
    if ((zDate[8] == '.') && (0xfffffffffffffff5 < (ulong)(byte)zDate[9] - 0x3a)) {
      zDate_00 = (byte *)(zDate + 9);
      uVar5 = (ulong)*zDate_00;
      dVar9 = 0.0;
      if (0xfffffffffffffff5 < uVar5 - 0x3a) {
        dVar10 = 1.0;
        do {
          dVar9 = dVar9 * 10.0 + (double)(int)(char)uVar5 + -48.0;
          dVar10 = dVar10 * 10.0;
          uVar5 = (ulong)zDate_00[1];
          zDate_00 = zDate_00 + 1;
        } while (0xfffffffffffffff5 < uVar5 - 0x3a);
        dVar9 = dVar9 / dVar10;
      }
      dVar10 = 0.999;
      if (dVar9 <= 0.999) {
        dVar10 = dVar9;
      }
    }
  }
  else {
    zDate_00 = (byte *)(zDate + 5);
    local_3c = 0;
    dVar10 = 0.0;
  }
  p->validJD = '\0';
  bVar1 = p->field_0x2c;
  p->field_0x2c = bVar1 & 0xfe;
  p->validHMS = '\x01';
  p->h = local_34;
  p->m = local_38;
  p->s = (double)local_3c + dVar10;
  local_2c = -0x55555556;
  local_30 = -0x55555556;
  do {
    pbVar7 = zDate_00;
    zDate_00 = pbVar7 + 1;
  } while ((""[*pbVar7] & 1) != 0);
  p->tz = 0;
  bVar2 = *pbVar7;
  if (bVar2 == 0x2d) {
    iVar3 = -1;
LAB_001b81e1:
    iVar4 = getDigits((char *)zDate_00,"20b:20e",&local_2c,&local_30);
    bVar8 = true;
    if (iVar4 == 2) {
      zDate_00 = pbVar7 + 6;
      p->tz = (local_2c * 0x3c + local_30) * iVar3;
LAB_001b8229:
      do {
        bVar2 = *zDate_00;
        zDate_00 = zDate_00 + 1;
      } while ((""[bVar2] & 1) != 0);
      goto LAB_001b823d;
    }
  }
  else {
    if (bVar2 == 0x2b) {
      iVar3 = 1;
      goto LAB_001b81e1;
    }
    if ((bVar2 & 0xdf) == 0x5a) {
      p->field_0x2c = bVar1 & 0xe6 | 8;
      goto LAB_001b8229;
    }
LAB_001b823d:
    bVar8 = bVar2 != 0;
  }
  uVar6 = (uint)bVar8;
LAB_001b8243:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
      /* Truncate to avoid problems with sub-milliseconds
      ** rounding. https://sqlite.org/forum/forumpost/766a2c9231 */
      if( ms>0.999 ) ms = 0.999;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  return 0;
}